

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O3

uint32_t fnode_service_recv_cmd(fnode_service_t *svc)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  _Bool _Var7;
  uint32_t uVar8;
  long lVar9;
  fnet_address_t *pfVar10;
  fnet_address_t *pfVar11;
  byte bVar12;
  size_t read_len;
  char resp_freq_str [5];
  char keepalive_str [5];
  fnet_address_t addr;
  char buf [65536];
  size_t sStack_100b0;
  undefined4 uStack_100a8;
  undefined1 uStack_100a4;
  undefined4 uStack_100a0;
  undefined1 uStack_1009c;
  fnet_address_t fStack_10098;
  int iStack_10018;
  undefined4 uStack_10014;
  undefined4 uStack_10010;
  
  bVar12 = 0;
  sStack_100b0 = 0;
  _Var7 = fnet_socket_recvfrom
                    (svc->socket,(char *)&iStack_10018,0x10000,&sStack_100b0,&fStack_10098);
  uVar8 = 0;
  if ((_Var7) && (uVar8 = 0, 3 < sStack_100b0)) {
    if (iStack_10018 == 0x41544144) {
      uVar8 = 0x41544144;
      (*svc->data_handler)(0x41544144,(char *)&uStack_10014,(int)sStack_100b0 - 4);
    }
    else if (iStack_10018 == 0x474e4f50) {
      uVar8 = 0x444c564e;
      if (sStack_100b0 == 4) {
        uVar8 = 0x474e4f50;
      }
    }
    else if ((iStack_10018 == 0x464e4f43) && (uVar8 = 0x444c564e, 0xb < sStack_100b0)) {
      uStack_100a0 = uStack_10014;
      uStack_100a8 = uStack_10010;
      uStack_1009c = 0;
      uStack_100a4 = 0;
      uVar8 = atoi((char *)&uStack_100a0);
      svc->keepalive = uVar8;
      uVar8 = atoi((char *)&uStack_100a8);
      svc->resp_freq = uVar8;
      pfVar10 = &fStack_10098;
      pfVar11 = &svc->server;
      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
        cVar1 = pfVar10->__ss_padding[0];
        cVar2 = pfVar10->__ss_padding[1];
        cVar3 = pfVar10->__ss_padding[2];
        cVar4 = pfVar10->__ss_padding[3];
        cVar5 = pfVar10->__ss_padding[4];
        cVar6 = pfVar10->__ss_padding[5];
        pfVar11->ss_family = pfVar10->ss_family;
        pfVar11->__ss_padding[0] = cVar1;
        pfVar11->__ss_padding[1] = cVar2;
        pfVar11->__ss_padding[2] = cVar3;
        pfVar11->__ss_padding[3] = cVar4;
        pfVar11->__ss_padding[4] = cVar5;
        pfVar11->__ss_padding[5] = cVar6;
        pfVar10 = (fnet_address_t *)((long)pfVar10 + ((ulong)bVar12 * -2 + 1) * 8);
        pfVar11 = (fnet_address_t *)((long)pfVar11 + (ulong)bVar12 * -0x10 + 8);
      }
      uVar8 = 0x464e4f43;
    }
  }
  return uVar8;
}

Assistant:

uint32_t fnode_service_recv_cmd(fnode_service_t *svc)
{
    char buf[65536];
    size_t read_len = 0;
    fnet_address_t addr;

    if (fnet_socket_recvfrom(svc->socket, buf, sizeof buf, &read_len, &addr))
    {
        if (read_len < FCMD_ID_LENGTH)
            return false;

        uint32_t const cmd = *(uint32_t const*)buf;

        switch(cmd)
        {
            case FCMD_CONF:
            {
                if (read_len < sizeof(fcmd_conf))
                    return FCMD_NVLD;
                fcmd_conf const *conf = (fcmd_conf const *)buf;
                char keepalive_str[sizeof conf->keepalive + 1];
                char resp_freq_str[sizeof conf->resp_freq + 1];
                memcpy(keepalive_str, conf->keepalive, sizeof conf->keepalive);
                memcpy(resp_freq_str, conf->resp_freq, sizeof conf->resp_freq);
                keepalive_str[sizeof conf->keepalive] = 0;
                resp_freq_str[sizeof conf->resp_freq] = 0;
                svc->keepalive = atoi(keepalive_str);
                svc->resp_freq = atoi(resp_freq_str);
                svc->server = addr;
                return cmd;
            }

            case FCMD_PONG:
            {
                return read_len == sizeof(fcmd_pong) ? cmd : FCMD_NVLD;
            }

            case FCMD_DATA:
            {
                svc->data_handler(cmd, buf + FCMD_ID_LENGTH, read_len - FCMD_ID_LENGTH);
                return cmd;
            }
        }
    }
    return false;
}